

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugins.c
# Opt level: O3

int ly_register_exts(lyext_plugin_list *plugin,char *log_name)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  uint *puVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  uint16_t uVar7;
  int iVar8;
  lyext_plugin_list *plVar9;
  char *pcVar10;
  LY_ERR no;
  ulong uVar11;
  uint *puVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  long lVar17;
  lyext_plugin_list *plVar18;
  char *__s1;
  char *local_38;
  
  plVar9 = ext_plugins;
  uVar7 = ext_plugins_count;
  local_38 = plugin->name;
  uVar16 = (uint)ext_plugins_count;
  if (local_38 == (char *)0x0) {
    uVar14 = 0;
  }
  else {
    uVar13 = (ulong)ext_plugins_count;
    uVar15 = 0;
    plVar18 = plugin;
    do {
      if (uVar7 != 0) {
        lVar17 = 0;
        do {
          iVar8 = strcmp(local_38,*(char **)((long)&plVar9->name + lVar17));
          if (iVar8 == 0) {
            __s1 = plVar18->module;
            iVar8 = strcmp(__s1,*(char **)((long)&plVar9->module + lVar17));
            if ((iVar8 == 0) &&
               (((plVar18->revision == (char *)0x0 ||
                 (pcVar10 = *(char **)((long)&plVar9->revision + lVar17), pcVar10 == (char *)0x0))
                || (iVar8 = strcmp(plVar18->revision,pcVar10), iVar8 == 0)))) {
              pcVar10 = 
              "Processing \"%s\" extension plugin failed,implementation collision for extension %s from module %s%s%s."
              ;
              no = LY_ESYS;
              goto LAB_0016fef8;
            }
          }
          lVar17 = lVar17 + 0x20;
        } while (uVar13 << 5 != lVar17);
      }
      if (((plVar18->plugin->type == LYEXT_COMPLEX) &&
          (puVar3 = *(uint **)(plVar18->plugin + 1), puVar3 != (uint *)0x0)) &&
         (uVar14 = *puVar3, uVar14 != 0)) {
        uVar11 = 1;
        puVar12 = puVar3;
        do {
          if (((0x37 < (int)uVar14) || (uVar14 == 0x16)) || (uVar14 == 0x13)) {
            __s1 = ly_stmt_str[uVar14];
            pcVar10 = 
            "Extension plugin \"%s\" (extension %s) allows not supported extension substatement (%s)"
            ;
LAB_0016feef:
            no = LY_EINVAL;
LAB_0016fef8:
            ly_log((ly_ctx *)0x0,LY_LLERR,no,pcVar10,log_name,local_38,__s1);
            return 1;
          }
          if ((uVar14 - 0x14 < 7) && (1 < puVar12[4])) {
            __s1 = ly_stmt_str[uVar14];
            pcVar10 = 
            "Extension plugin \"%s\" (extension %s) allows multiple instances on \"%s\" substatement, which is not supported."
            ;
            goto LAB_0016feef;
          }
          puVar12 = puVar3 + uVar11 * 6;
          uVar14 = *puVar12;
          uVar11 = (ulong)((int)uVar11 + 1);
        } while (uVar14 != 0);
      }
      uVar14 = (int)uVar15 + 1;
      uVar15 = (ulong)uVar14;
      plVar18 = plugin + uVar15;
      local_38 = plugin[uVar15].name;
    } while (local_38 != (char *)0x0);
  }
  plVar9 = (lyext_plugin_list *)realloc(plVar9,(ulong)(uVar16 + uVar14) << 5);
  if (plVar9 == (lyext_plugin_list *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","ly_register_exts");
    iVar8 = -1;
  }
  else {
    iVar8 = 0;
    ext_plugins = plVar9;
    if (uVar14 != 0) {
      lVar17 = (ulong)uVar14 << 5;
      do {
        uVar13 = (ulong)((uVar16 & 0xffff) << 5);
        puVar1 = (undefined8 *)((long)&plugin[-1].module + lVar17);
        uVar4 = *puVar1;
        uVar5 = puVar1[1];
        puVar1 = (undefined8 *)((long)plugin + lVar17 + -0x10);
        uVar6 = puVar1[1];
        puVar2 = (undefined8 *)((long)&plVar9->name + uVar13);
        *puVar2 = *puVar1;
        puVar2[1] = uVar6;
        puVar1 = (undefined8 *)((long)&plVar9->module + uVar13);
        *puVar1 = uVar4;
        puVar1[1] = uVar5;
        uVar16 = uVar16 + 1;
        lVar17 = lVar17 + -0x20;
      } while (lVar17 != 0);
      ext_plugins_count = (uint16_t)uVar16;
      iVar8 = 0;
    }
  }
  return iVar8;
}

Assistant:

API int
ly_register_exts(struct lyext_plugin_list *plugin, const char *log_name)
{
    struct lyext_plugin_list *p;
    struct lyext_plugin_complex *pluginc;
    uint32_t u, v;

    for (u = 0; plugin[u].name; u++) {
        /* check extension implementations for collisions */
        for (v = 0; v < ext_plugins_count; v++) {
            if (!strcmp(plugin[u].name, ext_plugins[v].name) &&
                    !strcmp(plugin[u].module, ext_plugins[v].module) &&
                    (!plugin[u].revision || !ext_plugins[v].revision || !strcmp(plugin[u].revision, ext_plugins[v].revision))) {
                LOGERR(NULL, LY_ESYS, "Processing \"%s\" extension plugin failed,"
                        "implementation collision for extension %s from module %s%s%s.",
                        log_name, plugin[u].name, plugin[u].module, plugin[u].revision ? "@" : "",
                        plugin[u].revision ? plugin[u].revision : "");
                return 1;
            }
        }

        /* check for valid supported substatements in case of complex extension */
        if (plugin[u].plugin->type == LYEXT_COMPLEX && ((struct lyext_plugin_complex *)plugin[u].plugin)->substmt) {
            pluginc = (struct lyext_plugin_complex *)plugin[u].plugin;
            for (v = 0; pluginc->substmt[v].stmt; v++) {
                if (pluginc->substmt[v].stmt >= LY_STMT_SUBMODULE ||
                        pluginc->substmt[v].stmt == LY_STMT_VERSION ||
                        pluginc->substmt[v].stmt == LY_STMT_YINELEM) {
                    LOGERR(NULL, LY_EINVAL,
                            "Extension plugin \"%s\" (extension %s) allows not supported extension substatement (%s)",
                            log_name, plugin[u].name, ly_stmt_str[pluginc->substmt[v].stmt]);
                    return 1;
                }
                if (pluginc->substmt[v].cardinality > LY_STMT_CARD_MAND &&
                        pluginc->substmt[v].stmt >= LY_STMT_MODIFIER &&
                        pluginc->substmt[v].stmt <= LY_STMT_STATUS) {
                    LOGERR(NULL, LY_EINVAL, "Extension plugin \"%s\" (extension %s) allows multiple instances on \"%s\" "
                           "substatement, which is not supported.",
                           log_name, plugin[u].name, ly_stmt_str[pluginc->substmt[v].stmt]);
                    return 1;
                }
            }
        }
    }

    /* add the new plugins, we have number of new plugins as u */
    p = realloc(ext_plugins, (ext_plugins_count + u) * sizeof *ext_plugins);
    if (!p) {
        LOGMEM(NULL);
        return -1;
    }
    ext_plugins = p;
    for (; u; u--) {
        memcpy(&ext_plugins[ext_plugins_count], &plugin[u - 1], sizeof *plugin);
        ext_plugins_count++;
    }

    return 0;
}